

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O3

int nghttp2_nv_equal(nghttp2_nv *a,nghttp2_nv *b)

{
  size_t __n;
  size_t __n_00;
  int iVar1;
  
  __n = a->namelen;
  iVar1 = 0;
  if ((__n == b->namelen) && (__n_00 = a->valuelen, iVar1 = 0, __n_00 == b->valuelen)) {
    if ((a->name == (uint8_t *)0x0) || (b->name == (uint8_t *)0x0)) {
      if (__n != 0) {
        __assert_fail("a->namelen == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                      ,0x3d5,"int nghttp2_nv_equal(const nghttp2_nv *, const nghttp2_nv *)");
      }
    }
    else {
      iVar1 = bcmp(a->name,b->name,__n);
      if (iVar1 != 0) {
        return 0;
      }
    }
    if ((a->value == (uint8_t *)0x0) || (b->value == (uint8_t *)0x0)) {
      if (__n_00 != 0) {
        __assert_fail("a->valuelen == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                      ,0x3dc,"int nghttp2_nv_equal(const nghttp2_nv *, const nghttp2_nv *)");
      }
    }
    else {
      iVar1 = bcmp(a->value,b->value,__n_00);
      if (iVar1 != 0) {
        return 0;
      }
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int nghttp2_nv_equal(const nghttp2_nv *a, const nghttp2_nv *b) {
  if (a->namelen != b->namelen || a->valuelen != b->valuelen) {
    return 0;
  }

  if (a->name == NULL || b->name == NULL) {
    assert(a->namelen == 0);
    assert(b->namelen == 0);
  } else if (memcmp(a->name, b->name, a->namelen) != 0) {
    return 0;
  }

  if (a->value == NULL || b->value == NULL) {
    assert(a->valuelen == 0);
    assert(b->valuelen == 0);
  } else if (memcmp(a->value, b->value, a->valuelen) != 0) {
    return 0;
  }

  return 1;
}